

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O0

Name __thiscall wasm::UniqueNameMapper::sourceToUnique(UniqueNameMapper *this,Name sName)

{
  IString IVar1;
  bool bVar2;
  mapped_type *pmVar3;
  ParseException *pPVar4;
  reference pvVar5;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_8d;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Self local_40;
  _Self local_38;
  UniqueNameMapper *local_30;
  UniqueNameMapper *this_local;
  Name sName_local;
  char *local_10;
  
  sName_local.super_IString.str._M_len = sName.super_IString.str._M_str;
  this_local = sName.super_IString.str._M_len;
  local_30 = this;
  bVar2 = IString::operator==((IString *)&this_local,(IString *)&DELEGATE_CALLER_TARGET);
  if (bVar2) {
    sName_local.super_IString.str._M_str = DELEGATE_CALLER_TARGET;
    local_10 = DAT_031942b8;
  }
  else {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
         ::find(&this->labelMappings,(key_type *)&this_local);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
         ::end(&this->labelMappings);
    bVar2 = std::operator==(&local_38,&local_40);
    if (bVar2) {
      local_8d = 1;
      pPVar4 = (ParseException *)__cxa_allocate_exception(0x30);
      IString::toString_abi_cxx11_(&local_80,(IString *)&this_local);
      std::operator+(&local_60,"bad label in sourceToUnique: ",&local_80);
      ParseException::ParseException(pPVar4,&local_60);
      local_8d = 0;
      __cxa_throw(pPVar4,&ParseException::typeinfo,ParseException::~ParseException);
    }
    pmVar3 = std::
             map<wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
             ::operator[](&this->labelMappings,(key_type *)&this_local);
    bVar2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::empty(pmVar3);
    if (bVar2) {
      pPVar4 = (ParseException *)__cxa_allocate_exception(0x30);
      IString::toString_abi_cxx11_(&local_d0,(IString *)&this_local);
      std::operator+(&local_b0,"use of popped label in sourceToUnique: ",&local_d0);
      ParseException::ParseException(pPVar4,&local_b0);
      __cxa_throw(pPVar4,&ParseException::typeinfo,ParseException::~ParseException);
    }
    pmVar3 = std::
             map<wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
             ::operator[](&this->labelMappings,(key_type *)&this_local);
    pvVar5 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::back(pmVar3);
    sName_local.super_IString.str._M_str = (char *)(pvVar5->super_IString).str._M_len;
    local_10 = (pvVar5->super_IString).str._M_str;
  }
  IVar1.str._M_str = local_10;
  IVar1.str._M_len = (size_t)sName_local.super_IString.str._M_str;
  return (IString)(IString)IVar1.str;
}

Assistant:

Name UniqueNameMapper::sourceToUnique(Name sName) {
  // DELEGATE_CALLER_TARGET is a fake target used to denote delegating to the
  // caller. We do not need to modify it, as it has no definitions, only uses.
  if (sName == DELEGATE_CALLER_TARGET) {
    return DELEGATE_CALLER_TARGET;
  }
  if (labelMappings.find(sName) == labelMappings.end()) {
    throw ParseException("bad label in sourceToUnique: " + sName.toString());
  }
  if (labelMappings[sName].empty()) {
    throw ParseException("use of popped label in sourceToUnique: " +
                         sName.toString());
  }
  return labelMappings[sName].back();
}